

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O2

column<Position> * __thiscall
flecs::iter::get_column<Position>
          (column<Position> *__return_storage_ptr__,iter *this,int32_t column_id)

{
  _Bool _Var1;
  ecs_entity_t eVar2;
  entity_t eVar3;
  Position *pPVar4;
  size_t sVar5;
  
  eVar2 = ecs_column_entity(this->m_iter,column_id);
  if (eVar2 >> 0x38 == 0) {
    eVar3 = _::component_info<Position>::id(this->m_iter->world,(char *)0x0,true);
    _ecs_assert(eVar2 == eVar3,0x17,(char *)0x0,
                "column_entity & ECS_TRAIT || column_entity & ECS_SWITCH || column_entity & ECS_CASE || column_entity == _::component_info<T>::id(m_iter->world)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0x285);
    eVar3 = _::component_info<Position>::id(this->m_iter->world,(char *)0x0,true);
    if (eVar2 != eVar3) {
      __assert_fail("column_entity & (((uint64_t)1 << 63) | ((ecs_entity_t)0x7A << 56)) || column_entity & (((uint64_t)1 << 63) | ((ecs_entity_t)0x7B << 56)) || column_entity & (((uint64_t)1 << 63) | ((ecs_entity_t)0x7C << 56)) || column_entity == _::component_info<T>::id(m_iter->world)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                    ,0x285,"flecs::column<T> flecs::iter::get_column(int32_t) const [T = Position]")
      ;
    }
  }
  else {
    _ecs_assert(true,0x17,(char *)0x0,
                "column_entity & ECS_TRAIT || column_entity & ECS_SWITCH || column_entity & ECS_CASE || column_entity == _::component_info<T>::id(m_iter->world)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0x285);
  }
  _Var1 = ecs_is_owned(this->m_iter,column_id);
  if (_Var1) {
    sVar5 = (size_t)this->m_iter->count;
  }
  else {
    sVar5 = 1;
  }
  pPVar4 = (Position *)ecs_column_w_size(this->m_iter,8,column_id);
  __return_storage_ptr__->m_array = pPVar4;
  __return_storage_ptr__->m_count = sVar5;
  __return_storage_ptr__->m_is_shared = !_Var1;
  return __return_storage_ptr__;
}

Assistant:

flecs::column<T> get_column(int32_t column_id) const {
#ifndef NDEBUG
        ecs_entity_t column_entity = ecs_column_entity(m_iter, column_id);
        ecs_assert(column_entity & ECS_TRAIT || column_entity & ECS_SWITCH || 
            column_entity & ECS_CASE ||
            column_entity == _::component_info<T>::id(m_iter->world), 
            ECS_COLUMN_TYPE_MISMATCH, NULL);
#endif

        size_t count;
        bool is_shared = !ecs_is_owned(m_iter, column_id);

        /* If a shared column is retrieved with 'column', there will only be a
         * single value. Ensure that the application does not accidentally read
         * out of bounds. */
        if (is_shared) {
            count = 1;
        } else {
            /* If column is owned, there will be as many values as there are
             * entities. */
            count = static_cast<size_t>(m_iter->count);
        }
        
        return flecs::column<T>(
            static_cast<T*>(ecs_column_w_size(m_iter, sizeof(T), column_id)), 
            count, is_shared);
    }